

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void wstran_listener_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  ws_listener *l;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  _Var1 = nni_aio_start(aio,wstran_listener_cancel,arg);
  if (_Var1) {
    nni_list_append((nni_list *)((long)arg + 8),aio);
    if ((*(byte *)((long)arg + 0x238) & 1) == 0) {
      *(undefined1 *)((long)arg + 0x238) = 1;
      nng_stream_listener_accept
                (*(nng_stream_listener **)((long)arg + 0x210),(nng_aio *)((long)arg + 0x48));
    }
    wstran_listener_match((ws_listener *)arg);
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  }
  return;
}

Assistant:

static void
wstran_listener_accept(void *arg, nni_aio *aio)
{
	ws_listener *l = arg;

	// We already bound, so we just need to look for an available
	// pipe (created by the handler), and match it.
	// Otherwise we stick the AIO in the accept list.
	nni_aio_reset(aio);
	nni_mtx_lock(&l->mtx);
	if (!nni_aio_start(aio, wstran_listener_cancel, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	nni_list_append(&l->aios, aio);
	if (!l->started) {
		l->started = true;
		nng_stream_listener_accept(l->listener, &l->accaio);
	}
	wstran_listener_match(l);
	nni_mtx_unlock(&l->mtx);
}